

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeBrOnCast<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool onFail)

{
  __index_type *__return_storage_ptr___00;
  Index label_00;
  Type in_00;
  Err *pEVar1;
  uint *puVar2;
  Type *pTVar3;
  bool bVar4;
  Err local_1b0;
  Err *local_190;
  Err *err_2;
  Result<wasm::Type> _val_2;
  Result<wasm::Type> out;
  Err *err_1;
  Result<wasm::Type> _val_1;
  Result<wasm::Type> in;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  Result<unsigned_int> _val;
  Result<unsigned_int> label;
  bool onFail_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20);
  labelidx<wasm::WATParser::ParseDefsCtx>
            ((Result<unsigned_int> *)__return_storage_ptr___00,ctx,false);
  Result<unsigned_int>::Result
            ((Result<unsigned_int> *)local_80,(Result<unsigned_int> *)__return_storage_ptr___00);
  local_98 = Result<unsigned_int>::getErr((Result<unsigned_int> *)local_80);
  bVar4 = local_98 == (Err *)0x0;
  if (!bVar4) {
    wasm::Err::Err(&local_b8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
    wasm::Err::~Err(&local_b8);
  }
  Result<unsigned_int>::~Result((Result<unsigned_int> *)local_80);
  if (bVar4) {
    reftype<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::Type> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),ctx);
    Result<wasm::Type>::Result
              ((Result<wasm::Type> *)&err_1,
               (Result<wasm::Type> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    pEVar1 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err_1);
    if (pEVar1 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&out.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),pEVar1);
      Result<wasm::Ok>::Result
                (__return_storage_ptr__,
                 (Err *)((long)&out.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&out.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    }
    Result<wasm::Type>::~Result((Result<wasm::Type> *)&err_1);
    if (pEVar1 == (Err *)0x0) {
      reftype<wasm::WATParser::ParseDefsCtx>
                ((Result<wasm::Type> *)
                 ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),ctx);
      Result<wasm::Type>::Result
                ((Result<wasm::Type> *)&err_2,
                 (Result<wasm::Type> *)
                 ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      local_190 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err_2);
      bVar4 = local_190 == (Err *)0x0;
      if (!bVar4) {
        wasm::Err::Err(&local_1b0,local_190);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1b0);
        wasm::Err::~Err(&local_1b0);
      }
      Result<wasm::Type>::~Result((Result<wasm::Type> *)&err_2);
      if (bVar4) {
        puVar2 = Result<unsigned_int>::operator*
                           ((Result<unsigned_int> *)
                            ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                    super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                    super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                    super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
        label_00 = *puVar2;
        pTVar3 = Result<wasm::Type>::operator*
                           ((Result<wasm::Type> *)
                            ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        in_00.id = pTVar3->id;
        pTVar3 = Result<wasm::Type>::operator*
                           ((Result<wasm::Type> *)
                            ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        ParseDefsCtx::makeBrOn
                  (__return_storage_ptr__,ctx,pos,annotations,label_00,
                   onFail & BrOnNonNull | BrOnCast,in_00,(Type)pTVar3->id);
      }
      Result<wasm::Type>::~Result
                ((Result<wasm::Type> *)
                 ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    }
    Result<wasm::Type>::~Result
              ((Result<wasm::Type> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
  }
  Result<unsigned_int>::~Result
            ((Result<unsigned_int> *)
             ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeBrOnCast(Ctx& ctx,
                      Index pos,
                      const std::vector<Annotation>& annotations,
                      bool onFail) {
  auto label = labelidx(ctx);
  CHECK_ERR(label);
  auto in = reftype(ctx);
  CHECK_ERR(in);
  auto out = reftype(ctx);
  CHECK_ERR(out);
  return ctx.makeBrOn(
    pos, annotations, *label, onFail ? BrOnCastFail : BrOnCast, *in, *out);
}